

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme.cpp
# Opt level: O0

string * __thiscall
psy::C::Lexeme::value<std::__cxx11::string>(string *__return_storage_ptr__,Lexeme *this)

{
  long lVar1;
  long lVar2;
  allocator local_39;
  undefined1 local_38 [8];
  string p;
  Lexeme *this_local;
  
  p.field_2._8_8_ = this;
  valueText_abi_cxx11_((string *)local_38,this);
  lVar1 = std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)(lVar1 + 1),lVar2 - 2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexeme::value<std::string>() const
{
    auto p = valueText();
    return std::string(p.c_str() + 1, p.size() - 2);
}